

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob-filter.c++
# Opt level: O3

void __thiscall kj::GlobFilter::applyState(GlobFilter *this,char c,int state)

{
  char cVar1;
  RemoveConst<unsigned_int> *pRVar2;
  RemoveConst<unsigned_int> *pRVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  
  uVar6 = (ulong)state;
  sVar5 = (this->pattern).content.size_;
  uVar4 = 0;
  if (sVar5 != 0) {
    uVar4 = sVar5 - 1;
  }
  if (uVar6 < uVar4) {
    do {
      cVar1 = (this->pattern).content.ptr[uVar6];
      if (cVar1 != '*') {
        if (cVar1 == '?') {
          if (c == '/') {
            return;
          }
          if (c == '\\') {
            return;
          }
        }
        else if (cVar1 != c) {
          return;
        }
        pRVar3 = (this->states).builder.pos;
        if (pRVar3 == (this->states).builder.endPtr) {
          pRVar2 = (this->states).builder.ptr;
          sVar5 = 4;
          if (pRVar3 != pRVar2) {
            sVar5 = (long)pRVar3 - (long)pRVar2 >> 1;
          }
          Vector<unsigned_int>::setCapacity(&this->states,sVar5);
          pRVar3 = (this->states).builder.pos;
        }
        *pRVar3 = (RemoveConst<unsigned_int>)uVar6 + 1;
        (this->states).builder.pos = pRVar3 + 1;
        return;
      }
      if ((c != '/') && (c != '\\')) {
        pRVar3 = (this->states).builder.pos;
        if (pRVar3 == (this->states).builder.endPtr) {
          pRVar2 = (this->states).builder.ptr;
          sVar5 = (long)pRVar3 - (long)pRVar2 >> 1;
          if (pRVar3 == pRVar2) {
            sVar5 = 4;
          }
          Vector<unsigned_int>::setCapacity(&this->states,sVar5);
          sVar5 = (this->pattern).content.size_;
          pRVar3 = (this->states).builder.pos;
        }
        *pRVar3 = (RemoveConst<unsigned_int>)uVar6;
        (this->states).builder.pos = pRVar3 + 1;
      }
      uVar6 = uVar6 + 1;
      uVar4 = sVar5 - 1;
      if (sVar5 == 0) {
        uVar4 = 0;
      }
    } while (uVar6 < uVar4);
  }
  return;
}

Assistant:

void GlobFilter::applyState(char c, int state) {
  if (state < pattern.size()) {
    switch (pattern[state]) {
      case '*':
        // At a '*', we both re-add the current state and attempt to match the *next* state.
        if (c != '/' && c != '\\') {  // '*' doesn't match '/'.
          states.add(state);
        }
        applyState(c, state + 1);
        break;

      case '?':
        // A '?' matches one character (never a '/').
        if (c != '/' && c != '\\') {
          states.add(state + 1);
        }
        break;

      default:
        // Any other character matches only itself.
        if (c == pattern[state]) {
          states.add(state + 1);
        }
        break;
    }
  }
}